

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O2

void __thiscall
DescriptorKeyInfo_GetExtPrivkeyInformation_root_Test::
DescriptorKeyInfo_GetExtPrivkeyInformation_root_Test
          (DescriptorKeyInfo_GetExtPrivkeyInformation_root_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005bf6b0;
  return;
}

Assistant:

TEST(DescriptorKeyInfo, GetExtPrivkeyInformation_root) {
  std::string extkey = "xprv9s21ZrQH143K3h3fDYiay8mocZ3afhfULfb5GX8kCBdno77K4HiA15Tg23wpbeF1pLfs1c5SPmYHrEpTuuRhxMwvKDwqdKiGJS9XFKzUsAF";
  ExtPrivkey privkey(extkey);
  std::string path = "m/0'/1";
  std::string ext_str = "[00000000]";
  std::string ext_path_str = "[00000000/0'/1]";
  std::string key_str;

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, ""));
  EXPECT_STREQ(key_str.c_str(), ext_str.c_str());

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, path));
  EXPECT_STREQ(key_str.c_str(), ext_path_str.c_str());
}